

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O0

int __thiscall File::truncate(File *this,char *__file,__off_t __length)

{
  int iVar1;
  bool local_1;
  
  if ((this->valid & 1U) == 0) {
    local_1 = false;
  }
  else {
    iVar1 = fileno((FILE *)this->stream);
    iVar1 = ftruncate(iVar1,0);
    local_1 = iVar1 == 0;
    this = (File *)(ulong)CONCAT31((int3)((uint)iVar1 >> 8),local_1);
  }
  return (int)CONCAT71((int7)((ulong)this >> 8),local_1);
}

Assistant:

bool File::truncate()
{
	if (!valid) return false;

#ifndef _WIN32
	return (::ftruncate(fileno(stream), 0) == 0);
#else
	return (_chsize(_fileno(stream), 0) == 0);
#endif
}